

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void wiz_hack_map(chunk *c,player *p,_func_void_chunk_ptr_void_ptr_loc__Bool_ptr_uint8_t_ptr *func,
                 void *closure)

{
  _Bool _Var1;
  loc grid;
  term *ptVar2;
  wchar_t y;
  long lVar3;
  wchar_t c_00;
  wchar_t wVar4;
  uint8_t color;
  _Bool show;
  uint8_t local_4a;
  _Bool local_49;
  player *local_48;
  _func_void_chunk_ptr_void_ptr_loc__Bool_ptr_uint8_t_ptr *local_40;
  void *local_38;
  
  lVar3 = (long)Term->sidebar_mode;
  if (0 < (Term->hgt - (row_top_map[lVar3] + row_bottom_map[lVar3])) / (int)(uint)tile_height) {
    y = Term->offset_y;
    ptVar2 = Term;
    wVar4 = y;
    local_48 = p;
    local_40 = func;
    local_38 = closure;
    do {
      if (0 < (~col_map[lVar3] + ptVar2->wid) / (int)(uint)tile_width) {
        wVar4 = ptVar2->offset_x;
        do {
          grid = (loc)loc(wVar4,y);
          _Var1 = square_in_bounds_fully((chunk_conflict *)c,grid);
          if (_Var1) {
            (*local_40)(c,local_38,grid,&local_49,&local_4a);
            if (local_49 == true) {
              _Var1 = loc_eq((loc_conflict)grid,local_48->grid);
              if (_Var1) {
                c_00 = L'@';
              }
              else {
                _Var1 = square_ispassable((chunk_conflict *)c,grid);
                if (_Var1) {
                  c_00 = L'*';
                }
                else {
                  c_00 = L'#';
                }
              }
              print_rel(c_00,local_4a,y,wVar4);
            }
          }
          wVar4 = wVar4 + L'\x01';
        } while (wVar4 < (~col_map[Term->sidebar_mode] + Term->wid) / (int)(uint)tile_width +
                         Term->offset_x);
        wVar4 = Term->offset_y;
        ptVar2 = Term;
      }
      y = y + L'\x01';
      lVar3 = (long)ptVar2->sidebar_mode;
    } while (y < (ptVar2->hgt - (row_top_map[lVar3] + row_bottom_map[lVar3])) /
                 (int)(uint)tile_height + wVar4);
  }
  return;
}

Assistant:

static void wiz_hack_map(struct chunk *c, struct player *p,
	void (*func)(struct chunk *, void *, struct loc, bool *, uint8_t *),
	void *closure)
{
	int y;

	for (y = Term->offset_y; y < Term->offset_y + SCREEN_HGT; y++) {
		int x;

		for (x = Term->offset_x; x < Term->offset_x + SCREEN_WID; x++) {
			struct loc grid = loc(x, y);
			bool show;
			uint8_t color;

			if (!square_in_bounds_fully(c, grid)) continue;

			(*func)(c, closure, grid, &show, &color);
			if (!show) continue;

			if (loc_eq(grid, p->grid)) {
				print_rel(L'@', color, y, x);
			} else if (square_ispassable(c, grid)) {
				print_rel(L'*', color, y, x);
			} else {
				print_rel(L'#', color, y, x);
			}
		}
	}
}